

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

void __thiscall amrex::BoxArray::uniqify(BoxArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  long lVar3;
  int aiVar4 [3];
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int dir;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint *puVar15;
  long lVar16;
  ulong uVar17;
  IntVect IVar18;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  int local_38 [3];
  
  p_Var1 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if ((p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) || (p_Var1->_M_use_count != 1)
     ) {
    local_48 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<amrex::BARef,std::allocator<amrex::BARef>,amrex::BARef&>
              (&_Stack_40,(BARef **)local_48,(allocator<amrex::BARef> *)local_38,
               (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var1 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_48;
    (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_40._M_pi;
    local_48 = (undefined1  [8])peVar2;
    _Stack_40._M_pi = p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
  }
  else {
    peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2->hash)._M_h._M_element_count != 0) {
      std::
      _Hashtable<amrex::IntVect,_std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<amrex::IntVect>,_amrex::IntVect::shift_hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(peVar2->hash)._M_h);
      ((this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      has_hashmap = false;
    }
  }
  IVar18 = BATransformer::coarsen_ratio(&this->m_bat);
  uVar9 = IVar18.vect[2];
  local_38[0] = IVar18.vect[0];
  local_38[1] = IVar18.vect[1];
  local_38[2] = IVar18.vect[2];
  aiVar4 = local_38;
  uVar5 = IVar18.vect[0];
  local_38[1] = IVar18.vect[1];
  if ((local_38[1] != 1 || (uVar5 ^ 1) != 0) || (uVar9 ^ 1) != 0) {
    peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar3 = *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data;
    uVar14 = (int)((long)*(pointer *)
                          ((long)&(peVar2->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data + 8) - lVar3 >> 2) * -0x49249249;
    if (0 < (int)uVar14) {
      lVar16 = lVar3 + 0xc;
      uVar17 = 0;
      do {
        if (((uVar5 ^ 1) != 0 || local_38[1] != 1) || (uVar9 ^ 1) != 0) {
          puVar15 = (uint *)(uVar17 * 0x1c + lVar3);
          uVar6 = *puVar15;
          if (uVar5 != 1) {
            if (uVar5 == 4) {
              if ((int)uVar6 < 0) {
                uVar6 = uVar6 + 1;
                uVar11 = -uVar6;
                if (0 < (int)uVar6) {
                  uVar11 = uVar6;
                }
                uVar11 = uVar11 >> 2;
LAB_0047fdde:
                uVar6 = ~uVar11;
              }
              else {
                uVar6 = uVar6 >> 2;
              }
            }
            else if (uVar5 == 2) {
              if ((int)uVar6 < 0) {
                uVar6 = uVar6 + 1;
                uVar11 = -uVar6;
                if (0 < (int)uVar6) {
                  uVar11 = uVar6;
                }
                uVar11 = uVar11 >> 1;
                goto LAB_0047fdde;
              }
              uVar6 = uVar6 >> 1;
            }
            else if ((int)uVar6 < 0) {
              iVar8 = uVar6 + 1;
              iVar7 = -iVar8;
              if (0 < iVar8) {
                iVar7 = iVar8;
              }
              uVar6 = ~(iVar7 / (int)uVar5);
            }
            else {
              uVar6 = (int)uVar6 / (int)uVar5;
            }
          }
          *puVar15 = uVar6;
          uVar6 = puVar15[1];
          if (local_38[1] != 1) {
            if (local_38[1] == 4) {
              if ((int)uVar6 < 0) {
                uVar6 = uVar6 + 1;
                uVar11 = -uVar6;
                if (0 < (int)uVar6) {
                  uVar11 = uVar6;
                }
                uVar11 = uVar11 >> 2;
LAB_0047fe43:
                uVar6 = ~uVar11;
              }
              else {
                uVar6 = uVar6 >> 2;
              }
            }
            else if (local_38[1] == 2) {
              if ((int)uVar6 < 0) {
                uVar6 = uVar6 + 1;
                uVar11 = -uVar6;
                if (0 < (int)uVar6) {
                  uVar11 = uVar6;
                }
                uVar11 = uVar11 >> 1;
                goto LAB_0047fe43;
              }
              uVar6 = uVar6 >> 1;
            }
            else if ((int)uVar6 < 0) {
              iVar8 = uVar6 + 1;
              iVar7 = -iVar8;
              if (0 < iVar8) {
                iVar7 = iVar8;
              }
              uVar6 = ~(iVar7 / local_38[1]);
            }
            else {
              uVar6 = (int)uVar6 / local_38[1];
            }
          }
          puVar15[1] = uVar6;
          uVar6 = puVar15[2];
          if (uVar9 != 1) {
            if (uVar9 == 4) {
              if ((int)uVar6 < 0) {
                uVar6 = uVar6 + 1;
                uVar11 = -uVar6;
                if (0 < (int)uVar6) {
                  uVar11 = uVar6;
                }
                uVar11 = uVar11 >> 2;
LAB_0047fea6:
                uVar6 = ~uVar11;
              }
              else {
                uVar6 = uVar6 >> 2;
              }
            }
            else if (uVar9 == 2) {
              if ((int)uVar6 < 0) {
                uVar6 = uVar6 + 1;
                uVar11 = -uVar6;
                if (0 < (int)uVar6) {
                  uVar11 = uVar6;
                }
                uVar11 = uVar11 >> 1;
                goto LAB_0047fea6;
              }
              uVar6 = uVar6 >> 1;
            }
            else if ((int)uVar6 < 0) {
              iVar8 = uVar6 + 1;
              iVar7 = -iVar8;
              if (0 < iVar8) {
                iVar7 = iVar8;
              }
              uVar6 = ~(iVar7 / (int)uVar9);
            }
            else {
              uVar6 = (int)uVar6 / (int)uVar9;
            }
          }
          puVar15[2] = uVar6;
          uVar6 = puVar15[6];
          if (uVar6 == 0) {
            uVar6 = puVar15[3];
            if (uVar5 != 1) {
              if (uVar5 == 4) {
                if ((int)uVar6 < 0) {
                  uVar6 = uVar6 + 1;
                  uVar11 = -uVar6;
                  if (0 < (int)uVar6) {
                    uVar11 = uVar6;
                  }
                  uVar11 = uVar11 >> 2;
LAB_004800da:
                  uVar6 = ~uVar11;
                }
                else {
                  uVar6 = uVar6 >> 2;
                }
              }
              else if (uVar5 == 2) {
                if ((int)uVar6 < 0) {
                  uVar6 = uVar6 + 1;
                  uVar11 = -uVar6;
                  if (0 < (int)uVar6) {
                    uVar11 = uVar6;
                  }
                  uVar11 = uVar11 >> 1;
                  goto LAB_004800da;
                }
                uVar6 = uVar6 >> 1;
              }
              else if ((int)uVar6 < 0) {
                iVar8 = uVar6 + 1;
                iVar7 = -iVar8;
                if (0 < iVar8) {
                  iVar7 = iVar8;
                }
                uVar6 = ~(iVar7 / (int)uVar5);
              }
              else {
                uVar6 = (int)uVar6 / (int)uVar5;
              }
            }
            puVar15[3] = uVar6;
            uVar6 = puVar15[4];
            if (local_38[1] != 1) {
              if (local_38[1] == 4) {
                if ((int)uVar6 < 0) {
                  uVar6 = uVar6 + 1;
                  uVar11 = -uVar6;
                  if (0 < (int)uVar6) {
                    uVar11 = uVar6;
                  }
                  uVar11 = uVar11 >> 2;
LAB_00480140:
                  uVar6 = ~uVar11;
                }
                else {
                  uVar6 = uVar6 >> 2;
                }
              }
              else if (local_38[1] == 2) {
                if ((int)uVar6 < 0) {
                  uVar6 = uVar6 + 1;
                  uVar11 = -uVar6;
                  if (0 < (int)uVar6) {
                    uVar11 = uVar6;
                  }
                  uVar11 = uVar11 >> 1;
                  goto LAB_00480140;
                }
                uVar6 = uVar6 >> 1;
              }
              else if ((int)uVar6 < 0) {
                iVar8 = uVar6 + 1;
                iVar7 = -iVar8;
                if (0 < iVar8) {
                  iVar7 = iVar8;
                }
                uVar6 = ~(iVar7 / local_38[1]);
              }
              else {
                uVar6 = (int)uVar6 / local_38[1];
              }
            }
            puVar15[4] = uVar6;
            uVar6 = puVar15[5];
            if (uVar9 != 1) {
              if (uVar9 == 4) {
                if ((int)uVar6 < 0) {
                  uVar6 = uVar6 + 1;
                  uVar11 = -uVar6;
                  if (0 < (int)uVar6) {
                    uVar11 = uVar6;
                  }
                  uVar11 = uVar11 >> 2;
LAB_004801b0:
                  uVar6 = ~uVar11;
                }
                else {
                  uVar6 = uVar6 >> 2;
                }
              }
              else if (uVar9 == 2) {
                if ((int)uVar6 < 0) {
                  uVar6 = uVar6 + 1;
                  uVar11 = -uVar6;
                  if (0 < (int)uVar6) {
                    uVar11 = uVar6;
                  }
                  uVar11 = uVar11 >> 1;
                  goto LAB_004801b0;
                }
                uVar6 = uVar6 >> 1;
              }
              else if ((int)uVar6 < 0) {
                iVar8 = uVar6 + 1;
                iVar7 = -iVar8;
                if (0 < iVar8) {
                  iVar7 = iVar8;
                }
                uVar6 = ~(iVar7 / (int)uVar9);
              }
              else {
                uVar6 = (int)uVar6 / (int)uVar9;
              }
            }
          }
          else {
            local_48 = (undefined1  [8])0x0;
            _Stack_40._M_pi = _Stack_40._M_pi & 0xffffffff00000000;
            lVar13 = 0;
            do {
              if (((uVar6 >> ((uint)lVar13 & 0x1f) & 1) != 0) &&
                 (*(int *)(lVar16 + lVar13 * 4) % local_38[lVar13] != 0)) {
                *(undefined4 *)(local_48 + lVar13 * 4) = 1;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            uVar11 = puVar15[3];
            if (uVar5 != 1) {
              if (uVar5 == 4) {
                if ((int)uVar11 < 0) {
                  uVar11 = uVar11 + 1;
                  uVar6 = -uVar11;
                  if (0 < (int)uVar11) {
                    uVar6 = uVar11;
                  }
                  uVar6 = uVar6 >> 2;
LAB_0047ff99:
                  uVar11 = ~uVar6;
                }
                else {
                  uVar11 = uVar11 >> 2;
                }
              }
              else if (uVar5 == 2) {
                if ((int)uVar11 < 0) {
                  uVar11 = uVar11 + 1;
                  uVar6 = -uVar11;
                  if (0 < (int)uVar11) {
                    uVar6 = uVar11;
                  }
                  uVar6 = uVar6 >> 1;
                  goto LAB_0047ff99;
                }
                uVar11 = uVar11 >> 1;
              }
              else if ((int)uVar11 < 0) {
                iVar8 = uVar11 + 1;
                iVar7 = -iVar8;
                if (0 < iVar8) {
                  iVar7 = iVar8;
                }
                uVar11 = ~(iVar7 / (int)uVar5);
              }
              else {
                uVar11 = (int)uVar11 / (int)uVar5;
              }
            }
            puVar15[3] = uVar11;
            uVar12 = puVar15[4];
            if (local_38[1] != 1) {
              if (local_38[1] == 4) {
                if ((int)uVar12 < 0) {
                  uVar12 = uVar12 + 1;
                  uVar6 = -uVar12;
                  if (0 < (int)uVar12) {
                    uVar6 = uVar12;
                  }
                  uVar6 = uVar6 >> 2;
LAB_0048000d:
                  uVar12 = ~uVar6;
                }
                else {
                  uVar12 = uVar12 >> 2;
                }
              }
              else if (local_38[1] == 2) {
                if ((int)uVar12 < 0) {
                  uVar12 = uVar12 + 1;
                  uVar6 = -uVar12;
                  if (0 < (int)uVar12) {
                    uVar6 = uVar12;
                  }
                  uVar6 = uVar6 >> 1;
                  goto LAB_0048000d;
                }
                uVar12 = uVar12 >> 1;
              }
              else if ((int)uVar12 < 0) {
                iVar8 = uVar12 + 1;
                iVar7 = -iVar8;
                if (0 < iVar8) {
                  iVar7 = iVar8;
                }
                uVar12 = ~(iVar7 / local_38[1]);
              }
              else {
                uVar12 = (int)uVar12 / local_38[1];
              }
            }
            puVar15[4] = uVar12;
            uVar6 = puVar15[5];
            if (uVar9 != 1) {
              if (uVar9 == 4) {
                if ((int)uVar6 < 0) {
                  uVar6 = uVar6 + 1;
                  uVar10 = -uVar6;
                  if (0 < (int)uVar6) {
                    uVar10 = uVar6;
                  }
                  uVar10 = uVar10 >> 2;
LAB_00480076:
                  uVar6 = ~uVar10;
                }
                else {
                  uVar6 = uVar6 >> 2;
                }
              }
              else if (uVar9 == 2) {
                if ((int)uVar6 < 0) {
                  uVar6 = uVar6 + 1;
                  uVar10 = -uVar6;
                  if (0 < (int)uVar6) {
                    uVar10 = uVar6;
                  }
                  uVar10 = uVar10 >> 1;
                  goto LAB_00480076;
                }
                uVar6 = uVar6 >> 1;
              }
              else if ((int)uVar6 < 0) {
                iVar8 = uVar6 + 1;
                iVar7 = -iVar8;
                if (0 < iVar8) {
                  iVar7 = iVar8;
                }
                uVar6 = ~(iVar7 / (int)uVar9);
              }
              else {
                uVar6 = (int)uVar6 / (int)uVar9;
              }
            }
            puVar15[5] = uVar6;
            puVar15[3] = uVar11 + local_48._0_4_;
            puVar15[4] = uVar12 + local_48._4_4_;
            uVar6 = uVar6 + (int)_Stack_40._M_pi;
          }
          puVar15[5] = uVar6;
        }
        uVar17 = uVar17 + 1;
        lVar16 = lVar16 + 0x1c;
      } while (uVar17 != (uVar14 & 0x7fffffff));
    }
    local_48 = (undefined1  [8])0x100000001;
    _Stack_40._M_pi._0_4_ = 1;
    local_38 = aiVar4;
    BATransformer::set_coarsen_ratio(&this->m_bat,(IntVect *)local_48);
    aiVar4 = local_38;
  }
  local_38 = aiVar4;
  p_Var1 = (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  return;
}

Assistant:

void
BoxArray::uniqify ()
{
    if (m_ref.use_count() == 1) {
        clear_hash_bin();
    } else {
        auto p = std::make_shared<BARef>(*m_ref);
        std::swap(m_ref,p);
    }
    IntVect cr = crseRatio();
    if (cr != IntVect::TheUnitVector()) {
        const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N; i++) {
            m_ref->m_abox[i].coarsen(cr);
        }
        m_bat.set_coarsen_ratio(IntVect::TheUnitVector());
    }
    m_simplified_list.reset();
}